

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

InvokeResult __thiscall
anon_unknown.dwarf_6a3e6b::cmForEachFunctionBlocker::invoke
          (cmForEachFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus,cmMakefile *mf)

{
  pointer lff;
  bool bVar1;
  int code;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined1 local_a0 [8];
  cmExecutionStatus status;
  cmListFileFunction *func;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range1;
  cmMakefile *mf_local;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions_local;
  cmForEachFunctionBlocker *this_local;
  InvokeResult result;
  
  this_local._6_1_ = true;
  this_local._7_1_ = false;
  __end1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin(functions);
  func = (cmListFileFunction *)
         std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end(functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                *)&func);
    if (!bVar1) {
      return this_local._6_2_;
    }
    status.Variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                  ::operator*(&__end1);
    cmExecutionStatus::cmExecutionStatus((cmExecutionStatus *)local_a0,mf);
    lff = status.Variables.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_c8);
    cmMakefile::ExecuteCommand(mf,(cmListFileFunction *)lff,(cmExecutionStatus *)local_a0,&local_c8)
    ;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_c8);
    bVar1 = cmExecutionStatus::GetReturnInvoked((cmExecutionStatus *)local_a0);
    if (bVar1) {
      __x = cmExecutionStatus::GetReturnVariables_abi_cxx11_((cmExecutionStatus *)local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_f0,__x);
      cmExecutionStatus::SetReturnInvoked(inStatus,&local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      this_local._6_2_ = (InvokeResult)CONCAT11(true,this_local._6_1_);
      bVar1 = true;
    }
    else {
      bVar1 = cmExecutionStatus::GetBreakInvoked((cmExecutionStatus *)local_a0);
      if (bVar1) {
        this_local._6_2_ = (InvokeResult)CONCAT11(true,this_local._6_1_);
        bVar1 = true;
      }
      else {
        bVar1 = cmExecutionStatus::GetContinueInvoked((cmExecutionStatus *)local_a0);
        if (bVar1) {
          bVar1 = true;
        }
        else {
          bVar1 = cmExecutionStatus::HasExitCode((cmExecutionStatus *)local_a0);
          if (bVar1) {
            code = cmExecutionStatus::GetExitCode((cmExecutionStatus *)local_a0);
            cmExecutionStatus::SetExitCode(inStatus,code);
            this_local._6_2_ = (InvokeResult)CONCAT11(true,this_local._6_1_);
            bVar1 = true;
          }
          else {
            bVar1 = cmSystemTools::GetFatalErrorOccurred();
            if (bVar1) {
              this_local._6_1_ = false;
              this_local._7_1_ = true;
              bVar1 = true;
            }
            else {
              bVar1 = false;
            }
          }
        }
      }
    }
    cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_a0);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
    ::operator++(&__end1);
  }
  return this_local._6_2_;
}

Assistant:

auto cmForEachFunctionBlocker::invoke(
  std::vector<cmListFileFunction> const& functions,
  cmExecutionStatus& inStatus, cmMakefile& mf) -> InvokeResult
{
  InvokeResult result = { true, false };
  // Invoke all the functions that were collected in the block.
  for (cmListFileFunction const& func : functions) {
    cmExecutionStatus status(mf);
    mf.ExecuteCommand(func, status);
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked(status.GetReturnVariables());
      result.Break = true;
      break;
    }
    if (status.GetBreakInvoked()) {
      result.Break = true;
      break;
    }
    if (status.GetContinueInvoked()) {
      break;
    }
    if (status.HasExitCode()) {
      inStatus.SetExitCode(status.GetExitCode());
      result.Break = true;
      break;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      result.Restore = false;
      result.Break = true;
      break;
    }
  }
  return result;
}